

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O1

double __thiscall MultivariateTracker::getCovariance(MultivariateTracker *this,long i,long j)

{
  pointer pdVar1;
  int iVar2;
  runtime_error *this_00;
  ulong uVar3;
  
  if (-1 < i) {
    iVar2 = (int)((long)(this->_statistics).
                        super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->_statistics).
                        super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4f72c235;
    if (((j < iVar2) && (-1 < j)) && (i < iVar2)) {
      uVar3 = (ulong)((int)j + iVar2 * (int)i);
      pdVar1 = (this->_covariance).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (uVar3 < (ulong)((long)(this->_covariance).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)pdVar1 >> 3)) {
        return pdVar1[uVar3];
      }
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Invalid covariance indices");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

double
    getCovariance(long const i,
                  long const j) const
    {
        const int numPoints = this->_statistics.size();
        if ((i < 0) || (i >= numPoints) || (j < 0) || (j >= numPoints)) throw std::runtime_error("Invalid covariance indices");
        int k = i * numPoints + j;
        return this->_covariance.at(k);
    }